

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dithering.cpp
# Opt level: O0

Methods __thiscall ON_Dithering::Method(ON_Dithering *this)

{
  ON_InternalXMLImpl *this_00;
  bool bVar1;
  wchar_t *path_to_node;
  ON_XMLVariant local_210;
  ON_XMLVariant local_118;
  undefined1 local_20 [8];
  ON_wString s;
  ON_Dithering *this_local;
  
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  s.m_s = (wchar_t *)this;
  path_to_node = XMLPathDit();
  ::ON_XMLVariant::ON_XMLVariant(&local_210,L"");
  ON_InternalXMLImpl::GetParameter(&local_118,this_00,path_to_node,L"dithering",&local_210);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)local_20);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_210);
  bVar1 = ::operator==(L"floyd-steinberg",(ON_wString *)local_20);
  this_local._4_4_ = (Methods)bVar1;
  ON_wString::~ON_wString((ON_wString *)local_20);
  return this_local._4_4_;
}

Assistant:

ON_Dithering::Methods ON_Dithering::Method(void) const
{
  const ON_wString s = m_impl->GetParameter(XMLPathDit(), ON_RDK_DITHERING_METHOD, L"").AsString();
  if (ON_RDK_DITHERING_METHOD_FLOYD_STEINBERG == s)
    return Methods::FloydSteinberg;

  return Methods::SimpleNoise;
}